

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::SourceCodeInfo_Location::MergePartialFromCodedStream
          (SourceCodeInfo_Location *this,CodedInputStream *input)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  uint32 uVar7;
  int value_1;
  uint32 length;
  int value;
  uint32 local_50;
  uint32 local_4c;
  Limit local_48;
  uint32 local_44;
  RepeatedField<int> *local_40;
  RepeatedField<int> *local_38;
  
  local_38 = &this->span_;
  local_40 = &this->path_;
LAB_001f5a01:
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (uVar7 = (uint32)(char)*puVar2, -1 < (char)*puVar2)) {
    input->last_tag_ = uVar7;
    input->buffer_ = puVar2 + 1;
  }
  else {
    uVar7 = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = uVar7;
  }
  if (uVar7 == 0) {
    return true;
  }
  switch(uVar7 >> 3) {
  case 1:
    if ((uVar7 & 7) == 0) {
      bVar3 = internal::WireFormatLite::
              ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (1,10,input,local_40);
    }
    else {
      if ((uVar7 & 7) != 2) goto switchD_001f5a4a_default;
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        local_50 = (int)(char)uVar1;
      }
      else {
        bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,&local_50);
        if (!bVar3) {
          bVar3 = false;
          goto joined_r0x001f5af2;
        }
      }
      local_48 = io::CodedInputStream::PushLimit(input,local_50);
      while (iVar5 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar5) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
          input->buffer_ = puVar2 + 1;
          bVar4 = true;
          local_4c = (int)(char)uVar1;
        }
        else {
          bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
        }
        bVar3 = false;
        if (bVar4 == false) goto joined_r0x001f5af2;
        local_44 = local_4c;
        iVar5 = (this->path_).total_size_;
        if ((this->path_).current_size_ == iVar5) {
          RepeatedField<int>::Reserve(local_40,iVar5 + 1);
        }
        iVar5 = (this->path_).current_size_;
        (this->path_).current_size_ = iVar5 + 1;
        (this->path_).elements_[iVar5] = local_44;
      }
      io::CodedInputStream::PopLimit(input,local_48);
      bVar3 = true;
    }
joined_r0x001f5af2:
    if (!bVar3) {
      return false;
    }
    puVar2 = input->buffer_;
    if ((input->buffer_end_ <= puVar2) || (*puVar2 != '\x12')) goto LAB_001f5a01;
    input->buffer_ = puVar2 + 1;
LAB_001f5bf5:
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      local_50 = (int)(char)uVar1;
    }
    else {
      bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,&local_50);
      if (!bVar3) {
        bVar3 = false;
        break;
      }
    }
    local_48 = io::CodedInputStream::PushLimit(input,local_50);
    while (iVar5 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar5) {
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        bVar4 = true;
        local_4c = (int)(char)uVar1;
      }
      else {
        bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
      }
      uVar7 = local_4c;
      bVar3 = false;
      if (bVar4 == false) goto joined_r0x001f5b16;
      iVar5 = (this->span_).total_size_;
      if ((this->span_).current_size_ == iVar5) {
        RepeatedField<int>::Reserve(local_38,iVar5 + 1);
      }
      iVar5 = (this->span_).current_size_;
      (this->span_).current_size_ = iVar5 + 1;
      (this->span_).elements_[iVar5] = uVar7;
    }
    io::CodedInputStream::PopLimit(input,local_48);
    bVar3 = true;
    break;
  case 2:
    if ((uVar7 & 7) != 0) {
      if ((uVar7 & 7) != 2) goto switchD_001f5a4a_default;
      goto LAB_001f5bf5;
    }
    bVar3 = internal::WireFormatLite::
            ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (1,0x12,input,local_38);
    break;
  case 3:
    if ((uVar7 & 7) != 2) goto switchD_001f5a4a_default;
    goto LAB_001f5ce1;
  case 4:
    if ((uVar7 & 7) != 2) goto switchD_001f5a4a_default;
    goto LAB_001f5d57;
  default:
    goto switchD_001f5a4a_default;
  }
joined_r0x001f5b16:
  if (!bVar3) {
    return false;
  }
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (*puVar2 == '\x1a')) {
    input->buffer_ = puVar2 + 1;
LAB_001f5ce1:
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
    if (this->leading_comments_ == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar6 = (string *)operator_new(0x20);
      (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
      psVar6->_M_string_length = 0;
      (psVar6->field_2)._M_local_buf[0] = '\0';
      this->leading_comments_ = psVar6;
    }
    bVar3 = internal::WireFormatLite::ReadString(input,this->leading_comments_);
    if (!bVar3) {
      return false;
    }
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->leading_comments_->_M_dataplus)._M_p,
               (int)this->leading_comments_->_M_string_length,PARSE);
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (*puVar2 == '\"')) {
      input->buffer_ = puVar2 + 1;
LAB_001f5d57:
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
      if (this->trailing_comments_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->trailing_comments_ = psVar6;
      }
      bVar3 = internal::WireFormatLite::ReadString(input,this->trailing_comments_);
      if (!bVar3) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->trailing_comments_->_M_dataplus)._M_p,
                 (int)this->trailing_comments_->_M_string_length,PARSE);
      if ((input->buffer_ == input->buffer_end_) &&
         ((input->buffer_size_after_limit_ != 0 ||
          (input->total_bytes_read_ == input->current_limit_)))) {
        input->last_tag_ = 0;
        input->legitimate_message_end_ = true;
        return true;
      }
    }
  }
  goto LAB_001f5a01;
switchD_001f5a4a_default:
  if ((uVar7 & 7) == 4) {
    return true;
  }
  bVar3 = internal::WireFormat::SkipField(input,uVar7,&this->_unknown_fields_);
  if (!bVar3) {
    return false;
  }
  goto LAB_001f5a01;
}

Assistant:

bool SourceCodeInfo_Location::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int32 path = 1 [packed = true];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_path())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 10, input, this->mutable_path())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_span;
        break;
      }

      // repeated int32 span = 2 [packed = true];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_span:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_span())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 18, input, this->mutable_span())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_leading_comments;
        break;
      }

      // optional string leading_comments = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_leading_comments:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_leading_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->leading_comments().data(), this->leading_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_trailing_comments;
        break;
      }

      // optional string trailing_comments = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_trailing_comments:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_trailing_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->trailing_comments().data(), this->trailing_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}